

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
          (ShaderPerformanceCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,PerfCaseType caseType)

{
  PerfCaseType caseType_local;
  char *description_local;
  char *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  ShaderPerformanceCase *this_local;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,NODETYPE_PERFORMANCE,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderPerformanceCase_015c9e90;
  this->m_renderCtx = renderCtx;
  this->m_caseType = caseType;
  std::__cxx11::string::string((string *)&this->m_vertShaderSource);
  std::__cxx11::string::string((string *)&this->m_fragShaderSource);
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::vector
            (&this->m_attributes);
  this->m_program = (ShaderProgram *)0x0;
  ShaderPerformanceMeasurer::ShaderPerformanceMeasurer(&this->m_measurer,renderCtx,caseType);
  de::SharedPtr<deqp::gls::ShaderPerformanceCase::InitialCalibration>::SharedPtr
            (&this->m_initialCalibration);
  return;
}

Assistant:

ShaderPerformanceCase::ShaderPerformanceCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, PerfCaseType caseType)
	: tcu::TestCase		(testCtx, tcu::NODETYPE_PERFORMANCE, name, description)
	, m_renderCtx		(renderCtx)
	, m_caseType		(caseType)
	, m_program			(DE_NULL)
	, m_measurer		(renderCtx, caseType)
{
}